

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManCnfAddStatic(sat_solver2 *pSat,Vec_Int_t *vCnf0,Vec_Int_t *vCnf1,int *Lits,int iLitOut,
                        int ProofId)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int ClaLits [6];
  uint local_48 [6];
  
  uVar10 = 0;
  bVar2 = true;
  do {
    pVVar7 = vCnf1;
    if (bVar2) {
      pVVar7 = vCnf0;
    }
    if (0 < pVVar7->nSize) {
      lVar6 = 0;
      do {
        iVar1 = pVVar7->pArray[lVar6];
        iVar5 = 1;
        lVar4 = 0;
        do {
          local_48[0] = uVar10 ^ iLitOut;
          switch(iVar1 >> ((byte)lVar4 & 0x1f) & 3) {
          case 0:
            goto switchD_0055de15_caseD_0;
          case 1:
            uVar8 = *(uint *)((long)Lits + lVar4 * 2);
            break;
          case 2:
            uVar8 = *(uint *)((long)Lits + lVar4 * 2) ^ 1;
            break;
          case 3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                          ,0x2c5,
                          "void Ga2_ManCnfAddStatic(sat_solver2 *, Vec_Int_t *, Vec_Int_t *, int *, int, int)"
                         );
          }
          lVar9 = (long)iVar5;
          iVar5 = iVar5 + 1;
          local_48[lVar9] = uVar8;
switchD_0055de15_caseD_0:
          lVar4 = lVar4 + 2;
        } while (lVar4 != 10);
        sat_solver2_addclause(pSat,(lit *)local_48,(lit *)(local_48 + iVar5),ProofId);
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar7->nSize);
    }
    uVar10 = 1;
    bVar3 = !bVar2;
    bVar2 = false;
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void Ga2_ManCnfAddStatic( sat_solver2 * pSat, Vec_Int_t * vCnf0, Vec_Int_t * vCnf1, int Lits[], int iLitOut, int ProofId )
{
    Vec_Int_t * vCnf;
    int i, k, b, Cube, Literal, nClaLits, ClaLits[6];
    for ( i = 0; i < 2; i++ )
    {
        vCnf = i ? vCnf1 : vCnf0;
        Vec_IntForEachEntry( vCnf, Cube, k )
        {
            nClaLits = 0;
            ClaLits[nClaLits++] = i ? lit_neg(iLitOut) : iLitOut;
            for ( b = 0; b < 5; b++ )
            {
                Literal = 3 & (Cube >> (b << 1));
                if ( Literal == 1 ) // value 0 --> add positive literal
                {
//                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = Lits[b];
                }
                else if ( Literal == 2 ) // value 1 --> add negative literal
                {
//                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = lit_neg(Lits[b]);
                }
                else if ( Literal != 0 )
                    assert( 0 );
            }
            sat_solver2_addclause( pSat, ClaLits, ClaLits+nClaLits, ProofId );
        }
    }
}